

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckms_quantiles.cc
# Opt level: O0

bool __thiscall prometheus::detail::CKMSQuantiles::insertBatch(CKMSQuantiles *this)

{
  size_t sVar1;
  bool bVar2;
  iterator __first;
  iterator pvVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  size_type sVar7;
  double dVar8;
  int local_6c;
  __normal_iterator<prometheus::detail::CKMSQuantiles::Item_*,_std::vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>_>
  local_68;
  __normal_iterator<prometheus::detail::CKMSQuantiles::Item_*,_std::vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>_>
  local_60;
  const_iterator local_58;
  int local_4c;
  value_type_conflict3 vStack_48;
  int delta;
  double v;
  size_t i;
  size_t item;
  size_t idx;
  double local_20;
  size_t start;
  CKMSQuantiles *this_local;
  
  if (this->buffer_count_ == 0) {
    this_local._7_1_ = false;
  }
  else {
    start = (size_t)this;
    __first = std::array<double,_500UL>::begin(&this->buffer_);
    pvVar3 = std::array<double,_500UL>::begin(&this->buffer_);
    std::sort<double*>(__first,pvVar3 + this->buffer_count_);
    local_20 = 0.0;
    bVar2 = std::
            vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
            ::empty(&this->sample_);
    if (bVar2) {
      pvVar4 = std::array<double,_500UL>::operator[](&this->buffer_,0);
      idx._4_4_ = 1;
      idx._0_4_ = 0;
      std::
      vector<prometheus::detail::CKMSQuantiles::Item,std::allocator<prometheus::detail::CKMSQuantiles::Item>>
      ::emplace_back<double&,int,int>
                ((vector<prometheus::detail::CKMSQuantiles::Item,std::allocator<prometheus::detail::CKMSQuantiles::Item>>
                  *)&this->sample_,pvVar4,(int *)((long)&idx + 4),(int *)&idx);
      local_20 = (double)((long)local_20 + 1);
      this->count_ = this->count_ + 1;
    }
    item = 1;
    i = 0;
    for (v = local_20; (ulong)v < this->buffer_count_; v = (double)((long)v + 1)) {
      pvVar4 = std::array<double,_500UL>::operator[](&this->buffer_,(size_type)v);
      vStack_48 = *pvVar4;
      while( true ) {
        sVar1 = item;
        sVar5 = std::
                vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
                ::size(&this->sample_);
        bVar2 = false;
        if (sVar1 < sVar5) {
          pvVar6 = std::
                   vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
                   ::operator[](&this->sample_,i);
          bVar2 = pvVar6->value < vStack_48;
        }
        if (!bVar2) break;
        i = item;
        item = item + 1;
      }
      pvVar6 = std::
               vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
               ::operator[](&this->sample_,i);
      if (vStack_48 < pvVar6->value) {
        item = item - 1;
      }
      if ((item == 1) ||
         (sVar5 = item + 1,
         sVar7 = std::
                 vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
                 ::size(&this->sample_), sVar5 == sVar7)) {
        local_4c = 0;
      }
      else {
        dVar8 = allowableError(this,(int)item + 1);
        dVar8 = floor(dVar8);
        local_4c = (int)dVar8 + 1;
      }
      local_68._M_current =
           (Item *)std::
                   vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
                   ::begin(&this->sample_);
      local_60 = __gnu_cxx::
                 __normal_iterator<prometheus::detail::CKMSQuantiles::Item_*,_std::vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>_>
                 ::operator+(&local_68,item);
      __gnu_cxx::
      __normal_iterator<prometheus::detail::CKMSQuantiles::Item_const*,std::vector<prometheus::detail::CKMSQuantiles::Item,std::allocator<prometheus::detail::CKMSQuantiles::Item>>>
      ::__normal_iterator<prometheus::detail::CKMSQuantiles::Item*>
                ((__normal_iterator<prometheus::detail::CKMSQuantiles::Item_const*,std::vector<prometheus::detail::CKMSQuantiles::Item,std::allocator<prometheus::detail::CKMSQuantiles::Item>>>
                  *)&local_58,&local_60);
      local_6c = 1;
      std::
      vector<prometheus::detail::CKMSQuantiles::Item,std::allocator<prometheus::detail::CKMSQuantiles::Item>>
      ::emplace<double&,int,int&>
                ((vector<prometheus::detail::CKMSQuantiles::Item,std::allocator<prometheus::detail::CKMSQuantiles::Item>>
                  *)&this->sample_,local_58,&stack0xffffffffffffffb8,&local_6c,&local_4c);
      this->count_ = this->count_ + 1;
      i = item;
      item = item + 1;
    }
    this->buffer_count_ = 0;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool CKMSQuantiles::insertBatch() {
  if (buffer_count_ == 0) {
    return false;
  }

  std::sort(buffer_.begin(), buffer_.begin() + buffer_count_);

  std::size_t start = 0;
  if (sample_.empty()) {
    sample_.emplace_back(buffer_[0], 1, 0);
    ++start;
    ++count_;
  }

  std::size_t idx = 0;
  std::size_t item = idx++;

  for (std::size_t i = start; i < buffer_count_; ++i) {
    double v = buffer_[i];
    while (idx < sample_.size() && sample_[item].value < v) {
      item = idx++;
    }

    if (sample_[item].value > v) {
      --idx;
    }

    int delta;
    if (idx - 1 == 0 || idx + 1 == sample_.size()) {
      delta = 0;
    } else {
      delta = static_cast<int>(std::floor(allowableError(idx + 1))) + 1;
    }

    sample_.emplace(sample_.begin() + idx, v, 1, delta);
    count_++;
    item = idx++;
  }

  buffer_count_ = 0;
  return true;
}